

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

char16_t * __thiscall icu_63::UnicodeString::getBuffer(UnicodeString *this,int32_t minCapacity)

{
  ushort uVar1;
  UBool UVar2;
  char16_t *pcVar3;
  
  if (minCapacity < -1) {
    pcVar3 = (char16_t *)0x0;
  }
  else {
    pcVar3 = (char16_t *)0x0;
    UVar2 = cloneArrayIfNeeded(this,minCapacity,-1,'\x01',(int32_t **)0x0,'\0');
    if (UVar2 != '\0') {
      uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      (this->fUnion).fStackFields.fLengthAndFlags = uVar1 & 0xf | 0x10;
      if ((uVar1 & 2) == 0) {
        pcVar3 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar3 = (char16_t *)((long)&this->fUnion + 2);
      }
    }
  }
  return pcVar3;
}

Assistant:

char16_t *
UnicodeString::getBuffer(int32_t minCapacity) {
  if(minCapacity>=-1 && cloneArrayIfNeeded(minCapacity)) {
    fUnion.fFields.fLengthAndFlags|=kOpenGetBuffer;
    setZeroLength();
    return getArrayStart();
  } else {
    return nullptr;
  }
}